

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O1

int cvProjInit(CVodeProjMem proj_mem)

{
  if (proj_mem != (CVodeProjMem)0x0) {
    proj_mem->first_proj = 1;
    proj_mem->nstlprj = 0;
    proj_mem->nproj = 0;
    proj_mem->npfails = 0;
    return 0;
  }
  return -0x1d;
}

Assistant:

int cvProjInit(CVodeProjMem proj_mem)
{
  /* check if projection memory exists */
  if (proj_mem == NULL) { return (CV_PROJ_MEM_NULL); }

  /* reset flags and counters */
  proj_mem->first_proj = SUNTRUE;
  proj_mem->nstlprj    = 0;
  proj_mem->nproj      = 0;
  proj_mem->npfails    = 0;

  return (CV_SUCCESS);
}